

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

BOOL __thiscall
Js::ScriptContext::IsNumericPropertyId(ScriptContext *this,PropertyId propertyId,uint32 *value)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  BOOL BVar5;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  size_t sVar8;
  char *message;
  char *error;
  uint lineNumber;
  uint32 local_2c [2];
  uint32 index;
  
  BVar4 = ThreadContext::IsNumericPropertyId(this->threadContext,propertyId,value);
  pPVar6 = ThreadContext::GetPropertyName(this->threadContext,propertyId);
  BVar5 = BVar4;
  if ((pPVar6 != (PropertyRecord *)0x0) && (BVar5 = 0, pPVar6->isSymbol == false)) {
    BVar5 = JavascriptArray::GetIndex((char16 *)(pPVar6 + 1),local_2c);
    if (BVar4 == BVar5) {
      if (BVar4 == 0) {
        return 0;
      }
      if (*value == local_2c[0]) {
        return BVar4;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      error = "((uint32)*value == index)";
      message = "(uint32)*value == index";
      lineNumber = 0x3b6;
    }
    else {
      uVar1 = pPVar6->byteCount;
      sVar8 = PAL_wcslen((char16_t *)(pPVar6 + 1));
      if (sVar8 != uVar1 >> 1) {
        return BVar4;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      error = "((size_t)(name->GetLength()) != PAL_wcslen(name->GetBuffer()))";
      message = "(size_t)(name->GetLength()) != wcslen(name->GetBuffer())";
      lineNumber = 0x3b2;
    }
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,lineNumber,error,message);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    BVar5 = BVar4;
  }
  return BVar5;
}

Assistant:

BOOL ScriptContext::IsNumericPropertyId(PropertyId propertyId, uint32* value)
    {
        BOOL isNumericPropertyId = threadContext->IsNumericPropertyId(propertyId, value);

#if DEBUG
        PropertyRecord const * name = this->GetPropertyName(propertyId);

        if (name != nullptr)
        {
            // Symbol properties are not numeric - description should not be used.
            if (name->IsSymbol())
            {
                return false;
            }

            uint32 index;
            BOOL isIndex = JavascriptArray::GetIndex(name->GetBuffer(), &index);
            if (isNumericPropertyId != isIndex)
            {
                // WOOB 1137798: JavascriptArray::GetIndex does not handle embedded NULLs. So if we have a property
                // name "1234\0", JavascriptArray::GetIndex would incorrectly accepts it as an array index property
                // name.
                Assert((size_t)(name->GetLength()) != wcslen(name->GetBuffer()));
            }
            else if (isNumericPropertyId)
            {
                Assert((uint32)*value == index);
            }
        }
#endif

        return isNumericPropertyId;
    }